

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseStartModuleField(WastParser *this,Module *module)

{
  bool bVar1;
  size_type sVar2;
  undefined1 local_d0 [32];
  Var var;
  undefined1 local_48 [8];
  Location loc;
  Module *module_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    GetLocation((Location *)local_48,this);
    sVar2 = std::vector<wabt::Var_*,_std::allocator<wabt::Var_*>_>::size(&module->starts);
    if (sVar2 == 0) {
      var.field_2._28_4_ = Expect(this,Start);
      bVar1 = Failed((Result)var.field_2._28_4_);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        Var::Var((Var *)(local_d0 + 0x18));
        local_d0._20_4_ = ParseVar(this,(Var *)(local_d0 + 0x18));
        bVar1 = Failed((Result)local_d0._20_4_);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          local_d0._12_4_ = Expect(this,Rpar);
          bVar1 = Failed((Result)local_d0._12_4_);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
          else {
            std::make_unique<wabt::StartModuleField,wabt::Var&,wabt::Location&>
                      ((Var *)local_d0,(Location *)(local_d0 + 0x18));
            Module::AppendField(module,(unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
                                        *)local_d0);
            std::unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>::
            ~unique_ptr((unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
                         *)local_d0);
            Result::Result((Result *)((long)&this_local + 4),Ok);
          }
        }
        local_d0._16_4_ = 1;
        Var::~Var((Var *)(local_d0 + 0x18));
      }
    }
    else {
      Error(this,0x324183);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseStartModuleField(Module* module) {
  WABT_TRACE(ParseStartModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  if (module->starts.size() > 0) {
    Error(loc, "multiple start sections");
    return Result::Error;
  }
  EXPECT(Start);
  Var var;
  CHECK_RESULT(ParseVar(&var));
  EXPECT(Rpar);
  module->AppendField(std::make_unique<StartModuleField>(var, loc));
  return Result::Ok;
}